

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::MethodDescriptorProto::ByteSizeLong(MethodDescriptorProto *this)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) == 0) {
    sVar2 = 0;
  }
  else {
    if ((uVar1 & 1) == 0) {
      lVar3 = 0;
    }
    else {
      sVar2 = internal::WireFormatLite::StringSize((this->name_).ptr_);
      lVar3 = sVar2 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->input_type_).ptr_);
      lVar3 = lVar3 + sVar2 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->output_type_).ptr_);
      lVar3 = lVar3 + sVar2 + 1;
    }
    if ((uVar1 & 8) != 0) {
      sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::MethodOptions>(this->options_)
      ;
      lVar3 = lVar3 + sVar2 + 1;
    }
    sVar2 = (ulong)((uVar1 >> 4 & 2) + (uVar1 >> 3 & 2)) + lVar3;
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar2;
    return sVar2;
  }
  sVar2 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar2,&this->_cached_size_);
  return sVar2;
}

Assistant:

size_t MethodDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.MethodDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string input_type = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_input_type());
    }

    // optional string output_type = 3;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_output_type());
    }

    // optional .google.protobuf.MethodOptions options = 4;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional bool client_streaming = 5 [default = false];
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 + 1;
    }

    // optional bool server_streaming = 6 [default = false];
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 + 1;
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}